

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O2

int __thiscall particleSamples::read_in_particle_samples_UrQMD_zipped(particleSamples *this)

{
  pretty_ostream *this_00;
  string *type;
  vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
  *this_01;
  int iVar1;
  istream *piVar2;
  double *pdVar3;
  particleSamples *ppVar4;
  allocator local_485;
  int n_particle;
  long local_480;
  int local_474;
  int urqmd_iso3;
  int urqmd_pid;
  double dummy;
  int urqmd_charge;
  int parent_proc_type;
  string temp_string;
  particle_info temp_particle_info;
  undefined1 local_3c0 [64];
  string local_380;
  string local_360;
  stringstream temp1;
  stringstream temp2;
  
  ppVar4 = (particleSamples *)this->full_particle_list;
  clear_out_previous_record
            (this,(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   *)ppVar4);
  temp_string._M_dataplus._M_p = (pointer)&temp_string.field_2;
  temp_string._M_string_length = 0;
  temp_string.field_2._M_local_buf[0] = '\0';
  this_00 = &this->messager;
  local_480 = 0;
  iVar1 = 0;
  while( true ) {
    local_474 = iVar1;
    if (this->event_buffer_size <= iVar1) break;
    gz_readline_abi_cxx11_((string *)&temp1,ppVar4,this->inputfile_gz);
    std::__cxx11::string::operator=((string *)&temp_string,(string *)&temp1);
    std::__cxx11::string::~string((string *)&temp1);
    iVar1 = gzeof(this->inputfile_gz);
    if (iVar1 != 0) break;
    this_01 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
               *)this->full_particle_list;
    _temp1 = (pointer)operator_new(0x18);
    _temp1[0] = '\0';
    _temp1[1] = '\0';
    _temp1[2] = '\0';
    _temp1[3] = '\0';
    _temp1[4] = '\0';
    _temp1[5] = '\0';
    _temp1[6] = '\0';
    _temp1[7] = '\0';
    _temp1[8] = '\0';
    _temp1[9] = '\0';
    _temp1[10] = '\0';
    _temp1[0xb] = '\0';
    _temp1[0xc] = '\0';
    _temp1[0xd] = '\0';
    _temp1[0xe] = '\0';
    _temp1[0xf] = '\0';
    _temp1[0x10] = '\0';
    _temp1[0x11] = '\0';
    _temp1[0x12] = '\0';
    _temp1[0x13] = '\0';
    _temp1[0x14] = '\0';
    _temp1[0x15] = '\0';
    _temp1[0x16] = '\0';
    _temp1[0x17] = '\0';
    std::
    vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
    ::emplace_back<std::vector<particle_info,std::allocator<particle_info>>*>
              (this_01,(vector<particle_info,_std::allocator<particle_info>_> **)&temp1);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&temp1,(string *)&temp_string,_S_out|_S_in);
    ppVar4 = (particleSamples *)&n_particle;
    std::istream::operator>>((istream *)&temp1,(int *)ppVar4);
    gz_readline_abi_cxx11_((string *)&temp2,ppVar4,this->inputfile_gz);
    ppVar4 = (particleSamples *)&temp2;
    std::__cxx11::string::operator=((string *)&temp_string,(string *)&temp2);
    std::__cxx11::string::~string((string *)&temp2);
    for (iVar1 = 0; iVar1 < n_particle; iVar1 = iVar1 + 1) {
      gz_readline_abi_cxx11_((string *)&temp2,ppVar4,this->inputfile_gz);
      std::__cxx11::string::operator=((string *)&temp_string,(string *)&temp2);
      std::__cxx11::string::~string((string *)&temp2);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&temp2,(string *)&temp_string,_S_out|_S_in);
      piVar2 = (istream *)std::istream::operator>>((istream *)&temp2,&urqmd_pid);
      piVar2 = (istream *)std::istream::operator>>(piVar2,&urqmd_iso3);
      pdVar3 = (double *)std::istream::operator>>(piVar2,&urqmd_charge);
      piVar2 = std::istream::_M_extract<double>(pdVar3);
      piVar2 = std::istream::_M_extract<double>((double *)piVar2);
      std::istream::operator>>(piVar2,&parent_proc_type);
      piVar2 = std::istream::_M_extract<double>((double *)&temp2);
      type = (string *)(local_3c0 + 0x20);
      piVar2 = std::istream::_M_extract<double>((double *)piVar2);
      piVar2 = std::istream::_M_extract<double>((double *)piVar2);
      piVar2 = std::istream::_M_extract<double>((double *)piVar2);
      piVar2 = std::istream::_M_extract<double>((double *)piVar2);
      piVar2 = std::istream::_M_extract<double>((double *)piVar2);
      piVar2 = std::istream::_M_extract<double>((double *)piVar2);
      piVar2 = std::istream::_M_extract<double>((double *)piVar2);
      std::istream::_M_extract<double>((double *)piVar2);
      temp_particle_info.monval = get_pdg_id(this,urqmd_pid,urqmd_iso3);
      if (temp_particle_info.monval == 0) {
        std::operator<<((ostream *)this_00,"nev = ");
        std::ostream::operator<<(this_00,(int)local_480);
        std::__cxx11::string::string((string *)&local_360,"error",&local_485);
        pretty_ostream::flush(this_00,&local_360);
        std::__cxx11::string::~string((string *)&local_360);
        std::operator<<((ostream *)this_00,"nparticles = ");
        std::ostream::operator<<(this_00,n_particle);
        std::operator<<((ostream *)this_00,", ipart = ");
        std::ostream::operator<<(this_00,iVar1);
        std::__cxx11::string::string((string *)&local_380,"error",&local_485);
        pretty_ostream::flush(this_00,&local_380);
        std::__cxx11::string::~string((string *)&local_380);
        std::operator<<((ostream *)this_00,"mass = ");
        std::ostream::_M_insert<double>(temp_particle_info.mass);
        std::operator<<((ostream *)this_00,", E = ");
        std::ostream::_M_insert<double>(temp_particle_info.E);
        std::operator<<((ostream *)this_00,", px = ");
        std::ostream::_M_insert<double>(temp_particle_info.px);
        std::operator<<((ostream *)this_00,", py = ");
        std::ostream::_M_insert<double>(temp_particle_info.py);
        std::operator<<((ostream *)this_00,", pz = ");
        std::ostream::_M_insert<double>(temp_particle_info.pz);
        std::operator<<((ostream *)this_00,", t = ");
        std::ostream::_M_insert<double>(temp_particle_info.t);
        std::operator<<((ostream *)this_00,", x = ");
        std::ostream::_M_insert<double>(temp_particle_info.x);
        std::operator<<((ostream *)this_00,", y = ");
        std::ostream::_M_insert<double>(temp_particle_info.y);
        std::operator<<((ostream *)this_00,", z = ");
        std::ostream::_M_insert<double>(temp_particle_info.z);
        std::__cxx11::string::string((string *)type,"error",&local_485);
        pretty_ostream::flush(this_00,type);
        std::__cxx11::string::~string((string *)type);
        std::operator<<((ostream *)this_00,"Ignore this particle!");
        std::__cxx11::string::string((string *)local_3c0,"error",&local_485);
        ppVar4 = (particleSamples *)local_3c0;
        pretty_ostream::flush(this_00,(string *)local_3c0);
        std::__cxx11::string::~string((string *)local_3c0);
      }
      else {
        ppVar4 = (particleSamples *)&temp_particle_info;
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  ((this->full_particle_list->
                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[local_480],(value_type *)ppVar4);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&temp2);
    }
    iVar1 = local_474 + n_particle;
    local_480 = local_480 + 1;
    std::__cxx11::stringstream::~stringstream((stringstream *)&temp1);
  }
  std::__cxx11::string::~string((string *)&temp_string);
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_UrQMD_zipped() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list);

    std::string temp_string;
    int n_particle;
    double dummy;
    int parent_proc_type;
    int ievent = 0;
    int urqmd_pid, urqmd_iso3, urqmd_charge;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        temp_string = gz_readline(inputfile_gz);

        if (gzeof(inputfile_gz)) break;

        full_particle_list->push_back(new vector<particle_info>);

        // get number of particles within the event
        std::stringstream temp1(temp_string);
        temp1 >> n_particle;

        // then get one useless line
        temp_string = gz_readline(inputfile_gz);

        for (int ipart = 0; ipart < n_particle; ipart++) {
            temp_string = gz_readline(inputfile_gz);
            std::stringstream temp2(temp_string);
            temp2 >> urqmd_pid >> urqmd_iso3 >> urqmd_charge >> dummy >> dummy
                >> parent_proc_type;

            particle_info temp_particle_info;
            temp2 >> temp_particle_info.mass >> temp_particle_info.t
                >> temp_particle_info.x >> temp_particle_info.y
                >> temp_particle_info.z >> temp_particle_info.E
                >> temp_particle_info.px >> temp_particle_info.py
                >> temp_particle_info.pz;
            temp_particle_info.monval = get_pdg_id(urqmd_pid, urqmd_iso3);
            if (temp_particle_info.monval == 0) {
                messager << "nev = " << ievent;
                messager.flush("error");
                messager << "nparticles = " << n_particle
                         << ", ipart = " << ipart;
                messager.flush("error");
                messager << "mass = " << temp_particle_info.mass
                         << ", E = " << temp_particle_info.E
                         << ", px = " << temp_particle_info.px
                         << ", py = " << temp_particle_info.py
                         << ", pz = " << temp_particle_info.pz
                         << ", t = " << temp_particle_info.t
                         << ", x = " << temp_particle_info.x
                         << ", y = " << temp_particle_info.y
                         << ", z = " << temp_particle_info.z;
                messager.flush("error");
                messager << "Ignore this particle!";
                messager.flush("error");
            } else {
                (*full_particle_list)[ievent]->push_back(temp_particle_info);
            }
        }
        num_particles += n_particle;
        ievent++;
    }
    return (0);
}